

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t array;
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  size_t slotCount;
  size_t slotCount_00;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  ulong local_110;
  size_t i_1;
  size_t i;
  size_t expressionCount;
  size_t pragmaCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_112_14_35c64a11 gcFrame;
  sysbvm_astSequenceNode_t **sequenceNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x70);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type =
       SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP|SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  pragmaCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&pragmaCount);
  sVar5 = *(sysbvm_tuple_t *)(*arguments + 0x28);
  array = *(sysbvm_tuple_t *)(*arguments + 0x30);
  slotCount = sysbvm_array_getSize(sVar5);
  slotCount_00 = sysbvm_array_getSize(array);
  if (((slotCount == 0) && (slotCount_00 == 0)) && (*(long *)(*arguments + 0x20) != 0)) {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&pragmaCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)*arguments;
  }
  else {
    gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
    sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar2);
    gcFrameRecord.roots[3] = sVar3;
    sVar3 = sysbvm_array_create(context,slotCount);
    for (i_1 = 0; i_1 < slotCount; i_1 = i_1 + 1) {
      sVar4 = sysbvm_array_at(sVar5,i_1);
      sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,sVar4,(context->roots).pragmaType,*psVar2);
      sysbvm_array_atPut(sVar3,i_1,sVar4);
    }
    gcFrameRecord.roots[5] = sVar3;
    sVar5 = sysbvm_array_create(context,slotCount_00);
    gcFrame.elementMetaType = (context->roots).voidType;
    for (local_110 = 0; local_110 < slotCount_00; local_110 = local_110 + 1) {
      sVar3 = sysbvm_array_at(array,local_110);
      if (local_110 + 1 < slotCount_00) {
        gcFrame.expression =
             sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,sVar3,(context->roots).voidType,*psVar2);
      }
      else {
        gcFrame.expression =
             sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                       (context,sVar3,*psVar2);
      }
      _Var1 = sysbvm_astNode_isLiteralNode(context,gcFrame.expression);
      if (_Var1) {
        sVar3 = sysbvm_astLiteralNode_getValue(gcFrame.expression);
        sVar3 = sysbvm_tuple_getType(context,sVar3);
        sVar4 = sysbvm_tuple_getType(context,sVar3);
        sVar4 = sysbvm_type_getAnalyzeConcreteMetaValueWithEnvironmentFunction(context,sVar4);
        if (sVar4 != 0) {
          gcFrame.expression =
               sysbvm_function_applyNoCheck3(context,sVar4,sVar3,gcFrame.expression,*psVar2);
        }
      }
      gcFrame.elementMetaType = sysbvm_astNode_getAnalyzedType(gcFrame.expression);
      sysbvm_array_atPut(sVar5,local_110,gcFrame.expression);
    }
    gcFrameRecord.roots[6] = sVar5;
    gcFrameRecord.roots[4] = gcFrame.elementMetaType;
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&pragmaCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    if ((slotCount == 0) && (slotCount_00 == 1)) {
      context_local = (sysbvm_context_t *)sysbvm_array_at(sVar5,0);
    }
    else {
      context_local = (sysbvm_context_t *)gcFrameRecord.roots;
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astSequenceNode_t **sequenceNode = (sysbvm_astSequenceNode_t**)node;

    struct {
        sysbvm_astSequenceNode_t *analyzedSequenceNode;

        sysbvm_tuple_t pragmas;
        sysbvm_tuple_t analyzedPragmas;
        sysbvm_tuple_t pragma;
        sysbvm_tuple_t analyzedPragma;

        sysbvm_tuple_t expressions;
        sysbvm_tuple_t analyzedExpressions;
        sysbvm_tuple_t expression;
        sysbvm_tuple_t analyzedExpression;

        sysbvm_tuple_t elementValue;
        sysbvm_tuple_t elementType;
        sysbvm_tuple_t elementMetaType;
        sysbvm_tuple_t resultType;
        sysbvm_tuple_t concretizeFunction;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sequenceNode)->super.sourcePosition);

    gcFrame.pragmas = (*sequenceNode)->pragmas;
    gcFrame.expressions = (*sequenceNode)->expressions;
    size_t pragmaCount = sysbvm_array_getSize(gcFrame.pragmas);
    size_t expressionCount = sysbvm_array_getSize(gcFrame.expressions);
    if(pragmaCount == 0 && expressionCount == 0 && (*sequenceNode)->super.analyzedType)
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return *node;
    }

    gcFrame.analyzedSequenceNode = (sysbvm_astSequenceNode_t *)sysbvm_context_shallowCopy(context, *node);
    gcFrame.analyzedSequenceNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    gcFrame.analyzedPragmas = sysbvm_array_create(context, pragmaCount);
    for(size_t i = 0; i < pragmaCount; ++i)
    {
        gcFrame.pragma = sysbvm_array_at(gcFrame.pragmas, i);
        gcFrame.analyzedPragma = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.pragma, context->roots.pragmaType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedPragmas, i, gcFrame.analyzedPragma);
    }

    gcFrame.analyzedSequenceNode->pragmas = gcFrame.analyzedPragmas;

    gcFrame.analyzedExpressions = sysbvm_array_create(context, expressionCount);
    gcFrame.resultType = context->roots.voidType;
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at(gcFrame.expressions, i);
        if(i + 1 < expressionCount)
            gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.expression, context->roots.voidType, *environment);
        else
            gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expression, *environment);

        // FIXME: Move this metavalue decay onto the type checker.
        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedExpression))
        {
            gcFrame.elementValue = sysbvm_astLiteralNode_getValue(gcFrame.analyzedExpression);
            gcFrame.elementType = sysbvm_tuple_getType(context, gcFrame.elementValue);
            gcFrame.elementMetaType = sysbvm_tuple_getType(context, gcFrame.elementType);
            gcFrame.concretizeFunction = sysbvm_type_getAnalyzeConcreteMetaValueWithEnvironmentFunction(context, gcFrame.elementMetaType);
            if(gcFrame.concretizeFunction)
                gcFrame.analyzedExpression = sysbvm_function_applyNoCheck3(context, gcFrame.concretizeFunction, gcFrame.elementType, gcFrame.analyzedExpression, *environment);
        }

        gcFrame.resultType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedExpression);
        sysbvm_array_atPut(gcFrame.analyzedExpressions, i, gcFrame.analyzedExpression);
    }

    gcFrame.analyzedSequenceNode->expressions = gcFrame.analyzedExpressions;
    gcFrame.analyzedSequenceNode->super.analyzedType = gcFrame.resultType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    if(pragmaCount == 0 && expressionCount == 1)
        return sysbvm_array_at(gcFrame.analyzedExpressions, 0);

    return (sysbvm_tuple_t)gcFrame.analyzedSequenceNode;
}